

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

ICallback * __thiscall Client::onConnected(Client *this,Client *client)

{
  Client *this_00;
  long lVar1;
  char *pcVar2;
  ssize_t sVar3;
  undefined8 *puVar4;
  ICallback *pIVar5;
  usize postponed;
  char *local_40;
  usize local_38;
  usize local_28;
  
  pcVar2 = String::operator_cast_to_char_((String *)(this + 0x30));
  Console::printf("Connected to %s:%d\n",pcVar2,(ulong)*(ushort *)(this + 0x58));
  if (this[0x5a] == (Client)0x1) {
    postponed = (usize)&local_40;
    local_28 = 0;
    local_40 = "HTTP/1.1 200 OK\r\n\r\n";
    local_38 = 0x13;
    this_00 = *(Client **)(this + 0x18);
    pcVar2 = String::operator_cast_to_char_((String *)&postponed);
    sVar3 = Server::Client::write(this_00,(int)pcVar2,*(void **)(postponed + 8),0);
    String::~String((String *)&postponed);
    if ((char)sVar3 != '\0') goto LAB_0010429b;
LAB_001042fc:
    pIVar5 = (ICallback *)0x0;
  }
  else {
LAB_0010429b:
    puVar4 = (undefined8 *)operator_new(0x18);
    *puVar4 = &PTR_onRead_0011bc90;
    puVar4[1] = client;
    puVar4[2] = this;
    *(undefined8 **)(this + 0x28) = puVar4;
    postponed = 0;
    lVar1 = *(long *)(this + 0x70);
    if (lVar1 == *(long *)(this + 0x78)) {
LAB_001042ed:
      Server::Client::resume(*(Client **)(this + 0x18));
    }
    else {
      sVar3 = Server::Client::write
                        (client,(int)lVar1,(void *)(*(long *)(this + 0x78) - lVar1),
                         (size_t)&postponed);
      if ((char)sVar3 == '\0') goto LAB_001042fc;
      Buffer::clear((Buffer *)(this + 0x68));
      if (postponed == 0) goto LAB_001042ed;
    }
    pIVar5 = *(ICallback **)(this + 0x28);
  }
  return pIVar5;
}

Assistant:

Server::Client::ICallback *Client::onConnected(Server::Client &client)
{
    Console::printf("Connected to %s:%d\n", (const char*)_target, (int)_targetPort);
    if (_httpConnectMethod)
    {
        String response("HTTP/1.1 200 OK\r\n\r\n");
        if (!_client.write((const byte*)(const char*)response, response.length()))
            return nullptr;
    }
    _uplink = new Uplink(*this, client);
    usize postponed = 0;
    if (!_receiveBuffer.isEmpty())
    {
        if (!client.write(_receiveBuffer, _receiveBuffer.size(), &postponed))
            return nullptr;
        _receiveBuffer.clear();
    }
    if (!postponed)
        _client.resume();
    return _uplink;
}